

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

void __thiscall efsw::DirectorySnapshot::~DirectorySnapshot(DirectorySnapshot *this)

{
  DirectorySnapshot *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::~map(&this->Files);
  FileInfo::~FileInfo(&this->DirectoryInfo);
  return;
}

Assistant:

DirectorySnapshot::~DirectorySnapshot() {}